

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int encode_string(char *dst,size_t dst_len,argon2_context *ctx,argon2_type type)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  char tmp [30];
  
  pcVar3 = argon2_type2string(type,0);
  iVar1 = validate_inputs(ctx);
  iVar11 = -0x1f;
  iVar2 = iVar11;
  if (((pcVar3 != (char *)0x0) && (iVar2 = iVar1, iVar1 == 0)) && (iVar2 = iVar11, 1 < dst_len)) {
    dst[0] = '$';
    dst[1] = '\0';
    sVar4 = strlen(pcVar3);
    uVar9 = (dst_len - 1) - sVar4;
    if (sVar4 <= dst_len - 1 && uVar9 != 0) {
      pcVar12 = dst + 1;
      memcpy(pcVar12,pcVar3,sVar4 + 1);
      if (3 < uVar9) {
        builtin_strncpy(dst + sVar4 + 1,"$v=",4);
        sprintf(tmp,"%lu",(ulong)ctx->version);
        sVar5 = strlen(tmp);
        uVar10 = (uVar9 - 3) - sVar5;
        if (sVar5 <= uVar9 - 3 && uVar10 != 0) {
          pcVar12 = pcVar12 + sVar4 + 3;
          memcpy(pcVar12,tmp,sVar5 + 1);
          if (3 < uVar10) {
            builtin_strncpy(dst + sVar5 + sVar4 + 4,"$m=",4);
            sprintf(tmp,"%lu",(ulong)ctx->m_cost);
            sVar6 = strlen(tmp);
            uVar9 = (uVar10 - 3) - sVar6;
            if (sVar6 <= uVar10 - 3 && uVar9 != 0) {
              pcVar12 = pcVar12 + sVar5 + 3;
              memcpy(pcVar12,tmp,sVar6 + 1);
              if (3 < uVar9) {
                builtin_strncpy(dst + sVar6 + sVar5 + sVar4 + 7,",t=",4);
                sprintf(tmp,"%lu",(ulong)ctx->t_cost);
                sVar7 = strlen(tmp);
                uVar10 = (uVar9 - 3) - sVar7;
                if (sVar7 <= uVar9 - 3 && uVar10 != 0) {
                  memcpy(pcVar12 + sVar6 + 3,tmp,sVar7 + 1);
                  if (3 < uVar10) {
                    builtin_strncpy(dst + sVar7 + sVar6 + sVar5 + sVar4 + 10,",p=",4);
                    sprintf(tmp,"%lu",(ulong)ctx->lanes);
                    sVar4 = strlen(tmp);
                    uVar9 = (uVar10 - 3) - sVar4;
                    if (sVar4 <= uVar10 - 3 && uVar9 != 0) {
                      pcVar3 = pcVar12 + sVar6 + 3 + sVar7 + 3;
                      memcpy(pcVar3,tmp,sVar4 + 1);
                      if (1 < uVar9) {
                        (pcVar3 + sVar4)[0] = '$';
                        (pcVar3 + sVar4)[1] = '\0';
                        pcVar3 = pcVar3 + sVar4 + 1;
                        sVar8 = to_base64(pcVar3,uVar9 - 1,ctx->salt,(ulong)ctx->saltlen);
                        if ((sVar8 != 0xffffffffffffffff) &&
                           (uVar9 = (uVar9 - 1) - sVar8, 1 < uVar9)) {
                          (pcVar3 + sVar8)[0] = '$';
                          (pcVar3 + sVar8)[1] = '\0';
                          sVar8 = to_base64(pcVar3 + sVar8 + 1,uVar9 - 1,ctx->out,(ulong)ctx->outlen
                                           );
                          iVar2 = -0x1f;
                          if (sVar8 != 0xffffffffffffffff) {
                            iVar2 = 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int encode_string(char *dst, size_t dst_len, argon2_context *ctx,
                  argon2_type type) {
#define SS(str)                                                                \
    do {                                                                       \
        size_t pp_len = strlen(str);                                           \
        if (pp_len >= dst_len) {                                               \
            return ARGON2_ENCODING_FAIL;                                       \
        }                                                                      \
        memcpy(dst, str, pp_len + 1);                                          \
        dst += pp_len;                                                         \
        dst_len -= pp_len;                                                     \
    } while ((void)0, 0)

#define SX(x)                                                                  \
    do {                                                                       \
        char tmp[30];                                                          \
        sprintf(tmp, "%lu", (unsigned long)(x));                               \
        SS(tmp);                                                               \
    } while ((void)0, 0)

#define SB(buf, len)                                                           \
    do {                                                                       \
        size_t sb_len = to_base64(dst, dst_len, buf, len);                     \
        if (sb_len == (size_t)-1) {                                            \
            return ARGON2_ENCODING_FAIL;                                       \
        }                                                                      \
        dst += sb_len;                                                         \
        dst_len -= sb_len;                                                     \
    } while ((void)0, 0)

    const char* type_string = argon2_type2string(type, 0);
    int validation_result = validate_inputs(ctx);

    if (!type_string) {
        return ARGON2_ENCODING_FAIL;
    }

    if (validation_result != ARGON2_OK) {
        return validation_result;
    }

    SS("$");
    SS(type_string);

    SS("$v=");
    SX(ctx->version);

    SS("$m=");
    SX(ctx->m_cost);
    SS(",t=");
    SX(ctx->t_cost);
    SS(",p=");
    SX(ctx->lanes);

    SS("$");
    SB(ctx->salt, ctx->saltlen);

    SS("$");
    SB(ctx->out, ctx->outlen);
    return ARGON2_OK;

#undef SS
#undef SX
#undef SB
}